

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long,duckdb::EntropyFunction<duckdb::ModeStandard<long>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      uVar9 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar4 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar4 = count;
          }
LAB_0056c4ae:
          uVar5 = uVar9;
          if (uVar9 < uVar4) {
            plVar8 = (long *)(lVar1 + uVar9 * 8);
            do {
              BaseModeFunction<duckdb::ModeStandard<long>>::
              Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::EntropyFunction<duckdb::ModeStandard<long>>>
                        ((ModeState<long,_duckdb::ModeStandard<long>_> *)state,plVar8,
                         aggr_input_data);
              uVar9 = uVar9 + 1;
              plVar8 = plVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar9);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(input + 0x28) + uVar6 * 8);
          uVar4 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar4 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_0056c4ae;
          uVar5 = uVar4;
          if ((uVar2 != 0) && (uVar5 = uVar9, uVar9 < uVar4)) {
            plVar8 = (long *)(lVar1 + uVar9 * 8);
            uVar7 = 0;
            do {
              if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<long>>::
                Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::EntropyFunction<duckdb::ModeStandard<long>>>
                          ((ModeState<long,_duckdb::ModeStandard<long>_> *)state,plVar8,
                           aggr_input_data);
              }
              uVar7 = uVar7 + 1;
              plVar8 = plVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 - uVar9 != uVar7);
          }
        }
        uVar6 = uVar6 + 1;
        uVar9 = uVar5;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<long>>::
      ConstantOperation<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::EntropyFunction<duckdb::ModeStandard<long>>>
                ((ModeState<long,_duckdb::ModeStandard<long>_> *)state,*(long **)(input + 0x20),
                 &local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar3 = ((local_78.input)->bind_data).ptr;
        uVar9 = 0;
        do {
          uVar6 = uVar9;
          if (pFVar3 != (FunctionData *)0x0) {
            uVar6 = (ulong)*(uint *)(pFVar3 + uVar9 * 4);
          }
          BaseModeFunction<duckdb::ModeStandard<long>>::
          Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::EntropyFunction<duckdb::ModeStandard<long>>>
                    ((ModeState<long,_duckdb::ModeStandard<long>_> *)state,
                     (long *)(&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                               validity_mask + uVar6),aggr_input_data);
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
    }
    else if (count != 0) {
      pFVar3 = ((local_78.input)->bind_data).ptr;
      uVar9 = 0;
      do {
        uVar6 = uVar9;
        if (pFVar3 != (FunctionData *)0x0) {
          uVar6 = (ulong)*(uint *)(pFVar3 + uVar9 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<long>>::
          Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::EntropyFunction<duckdb::ModeStandard<long>>>
                    ((ModeState<long,_duckdb::ModeStandard<long>_> *)state,
                     (long *)(&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                               validity_mask + uVar6),aggr_input_data);
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}